

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O1

void IoTHubTransportHttp_Unregister(IOTHUB_DEVICE_HANDLE deviceHandle)

{
  long lVar1;
  IOTHUB_DEVICE_HANDLE *elements;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (deviceHandle == (IOTHUB_DEVICE_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                 ,"IoTHubTransportHttp_Unregister",0x34f,1,"Unregister a NULL device handle");
      return;
    }
  }
  else {
    lVar1 = *deviceHandle;
    elements = get_perDeviceDataItem(deviceHandle);
    if (elements != (IOTHUB_DEVICE_HANDLE *)0x0) {
      destroy_perDeviceData((HTTPTRANSPORT_PERDEVICE_DATA *)*elements);
      VECTOR_erase(*(VECTOR_HANDLE *)(lVar1 + 0x18),elements,1);
      free(deviceHandle);
      return;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                 ,"IoTHubTransportHttp_Unregister",0x358,1,
                 "Device Handle [%p] not found in transport",deviceHandle);
    }
  }
  return;
}

Assistant:

static void IoTHubTransportHttp_Unregister(IOTHUB_DEVICE_HANDLE deviceHandle)
{
    if (deviceHandle == NULL)
    {
        LogError("Unregister a NULL device handle");
    }
    else
    {
        HTTPTRANSPORT_PERDEVICE_DATA* deviceHandleData = (HTTPTRANSPORT_PERDEVICE_DATA*)deviceHandle;
        HTTPTRANSPORT_HANDLE_DATA* handleData = deviceHandleData->transportHandle;
        IOTHUB_DEVICE_HANDLE* listItem = get_perDeviceDataItem(deviceHandle);
        if (listItem == NULL)
        {
            LogError("Device Handle [%p] not found in transport", deviceHandle);
        }
        else
        {
            HTTPTRANSPORT_PERDEVICE_DATA * perDeviceItem = (HTTPTRANSPORT_PERDEVICE_DATA *)(*listItem);

            destroy_perDeviceData(perDeviceItem);
            VECTOR_erase(handleData->perDeviceList, listItem, 1);
            free(deviceHandleData);
        }
    }

    return;
}